

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O0

uint32_t helper_sadd8_arm(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int32_t sum_3;
  int32_t sum_2;
  int32_t sum_1;
  int32_t sum;
  uint32_t ge;
  uint32_t res;
  void *gep_local;
  uint32_t b_local;
  uint32_t a_local;
  
  uVar1 = (int)(char)a + (int)(char)b;
  sum_1 = (int32_t)(-1 < (int)uVar1);
  uVar2 = (int)(char)(a >> 8) + (int)(char)(b >> 8);
  if (-1 < (int)uVar2) {
    sum_1 = sum_1 | 2;
  }
  uVar3 = (int)(char)(a >> 0x10) + (int)(char)(b >> 0x10);
  if (-1 < (int)uVar3) {
    sum_1 = sum_1 | 4;
  }
  iVar4 = (int)(char)(a >> 0x18) + (int)(char)(b >> 0x18);
  if (-1 < iVar4) {
    sum_1 = sum_1 | 8;
  }
  *(int32_t *)gep = sum_1;
  return iVar4 * 0x1000000 | (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
}

Assistant:

uint32_t HELPER(glue(PFX,add8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD8(a, b, 0);
    ADD8(a >> 8, b >> 8, 1);
    ADD8(a >> 16, b >> 16, 2);
    ADD8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}